

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void __thiscall Rml::ElementText::ElementText(ElementText *this,String *tag)

{
  String *tag_local;
  ElementText *this_local;
  
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementText_008169f8;
  ::std::__cxx11::string::string((string *)&this->text);
  ::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::vector
            (&this->lines);
  ::std::
  vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>::
  vector(&this->geometry);
  ::std::unique_ptr<Rml::Geometry,std::default_delete<Rml::Geometry>>::
  unique_ptr<std::default_delete<Rml::Geometry>,void>
            ((unique_ptr<Rml::Geometry,std::default_delete<Rml::Geometry>> *)&this->decoration);
  Colour<unsigned_char,_255,_true>::Colour(&this->colour,0xff,0xff,0xff,0xff);
  this->opacity = 1.0;
  this->font_handle_version = 0;
  this->field_0x1ec = this->field_0x1ec & 0xfe | 1;
  this->field_0x1ec = this->field_0x1ec & 0xfd | 2;
  this->generated_decoration = None;
  this->decoration_property = None;
  this->font_effects_dirty = true;
  this->font_effects_handle = 0;
  return;
}

Assistant:

ElementText::ElementText(const String& tag) :
	Element(tag), colour(255, 255, 255), opacity(1), font_handle_version(0), geometry_dirty(true), dirty_layout_on_change(true),
	generated_decoration(Style::TextDecoration::None), decoration_property(Style::TextDecoration::None), font_effects_dirty(true),
	font_effects_handle(0)
{}